

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SomeTests.cpp
# Opt level: O0

void __thiscall
OrderBookTests_OrderRemovalWorks_Test::OrderBookTests_OrderRemovalWorks_Test
          (OrderBookTests_OrderRemovalWorks_Test *this)

{
  OrderBookTests_OrderRemovalWorks_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__OrderBookTests_OrderRemovalWorks_Test_001a9020
  ;
  return;
}

Assistant:

TEST(OrderBookTests, OrderRemovalWorks){
    OrderBook book;
    book.add_bid(123, 456);
    book.remove_bid(123,156);
    auto bidask = book.get_bid_ask();
    EXPECT_TRUE(bidask.bid.is_initialized());
    auto bid = bidask.bid.get();
    EXPECT_EQ(123, bid.first);
    EXPECT_EQ(456-156, bid.second);
}